

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.h
# Opt level: O3

void mz_zip_reader_sort_central_dir_offsets_by_filename(mz_zip_archive *pZip)

{
  long lVar1;
  byte bVar2;
  ushort uVar3;
  ushort uVar4;
  uint *puVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  bool bVar11;
  byte bVar12;
  int iVar13;
  ulong uVar14;
  mz_uint32 t;
  int iVar15;
  long *in_RSI;
  ulong uVar16;
  uint uVar17;
  int iVar18;
  byte *pbVar19;
  int iVar20;
  uint uVar21;
  byte bVar22;
  byte *pbVar23;
  byte *pbVar24;
  
  puVar5 = (uint *)in_RSI[8];
  iVar13 = (int)pZip;
  iVar8 = iVar13 + -2 >> 1;
  iVar20 = iVar8;
  if (-1 < iVar8) {
joined_r0x003a18ae:
    do {
      iVar18 = iVar8 * 2 + 1;
      if (iVar18 < iVar13) {
        iVar15 = iVar8 * 2 + 2;
        uVar17 = 0;
        lVar6 = *in_RSI;
        lVar7 = in_RSI[4];
        if (iVar15 < iVar13) {
          uVar9 = (ulong)*(uint *)(lVar7 + (ulong)puVar5[iVar18] * 4);
          uVar16 = (ulong)*(uint *)(lVar7 + (ulong)puVar5[iVar15] * 4);
          lVar1 = lVar6 + uVar9;
          pbVar19 = (byte *)(lVar1 + 0x2e);
          uVar3 = *(ushort *)(lVar1 + 0x1c);
          uVar4 = *(ushort *)(lVar6 + 0x1c + uVar16);
          uVar17 = (uint)uVar4;
          if ((uint)uVar3 < (uint)uVar4) {
            uVar17 = (uint)uVar3;
          }
          pbVar23 = (byte *)(lVar6 + uVar9 + (ulong)uVar17 + 0x2e);
          if (uVar17 == 0) {
            bVar22 = 0;
            bVar12 = 0;
          }
          else {
            pbVar24 = (byte *)(uVar16 + lVar6 + 0x2e);
            do {
              bVar12 = *pbVar19;
              bVar22 = bVar12 + 0x20;
              if (0x19 < (byte)(bVar12 + 0xbf)) {
                bVar22 = bVar12;
              }
              bVar2 = *pbVar24;
              bVar12 = bVar2 + 0x20;
              if (0x19 < (byte)(bVar2 + 0xbf)) {
                bVar12 = bVar2;
              }
              if (bVar22 != bVar12) break;
              pbVar19 = pbVar19 + 1;
              pbVar24 = pbVar24 + 1;
              bVar12 = bVar22;
            } while (pbVar19 < pbVar23);
          }
          bVar11 = bVar22 < bVar12;
          if (pbVar19 == pbVar23) {
            bVar11 = uVar3 < uVar4;
          }
          uVar17 = (uint)bVar11;
        }
        iVar18 = uVar17 + iVar18;
        uVar17 = puVar5[iVar8];
        uVar9 = (ulong)*(uint *)(lVar7 + (ulong)uVar17 * 4);
        uVar16 = (ulong)*(uint *)(lVar7 + (ulong)puVar5[iVar18] * 4);
        lVar7 = lVar6 + uVar9;
        pbVar19 = (byte *)(lVar7 + 0x2e);
        uVar3 = *(ushort *)(lVar7 + 0x1c);
        uVar4 = *(ushort *)(lVar6 + 0x1c + uVar16);
        uVar21 = (uint)uVar4;
        if ((uint)uVar3 < (uint)uVar4) {
          uVar21 = (uint)uVar3;
        }
        pbVar23 = (byte *)(lVar6 + uVar9 + (ulong)uVar21 + 0x2e);
        if (uVar21 == 0) {
          bVar22 = 0;
          bVar12 = 0;
        }
        else {
          pbVar24 = (byte *)(lVar6 + uVar16 + 0x2e);
          do {
            bVar12 = *pbVar19;
            bVar22 = bVar12 + 0x20;
            if (0x19 < (byte)(bVar12 + 0xbf)) {
              bVar22 = bVar12;
            }
            bVar2 = *pbVar24;
            bVar12 = bVar2 + 0x20;
            if (0x19 < (byte)(bVar2 + 0xbf)) {
              bVar12 = bVar2;
            }
            if (bVar22 != bVar12) break;
            pbVar19 = pbVar19 + 1;
            pbVar24 = pbVar24 + 1;
            bVar12 = bVar22;
          } while (pbVar19 < pbVar23);
        }
        bVar11 = bVar12 <= bVar22;
        if (pbVar19 == pbVar23) {
          bVar11 = uVar4 <= uVar3;
        }
        if (!bVar11) {
          puVar5[iVar8] = puVar5[iVar18];
          puVar5[iVar18] = uVar17;
          iVar8 = iVar18;
          goto joined_r0x003a18ae;
        }
      }
      iVar8 = iVar20 + -1;
      bVar11 = 0 < iVar20;
      iVar20 = iVar8;
    } while (bVar11);
  }
  if (1 < iVar13) {
    uVar9 = (ulong)pZip & 0xffffffff;
    do {
      uVar17 = puVar5[uVar9 - 1];
      puVar5[uVar9 - 1] = *puVar5;
      *puVar5 = uVar17;
      if (uVar9 < 3) {
        return;
      }
      uVar16 = uVar9 - 1;
      iVar13 = 0;
      iVar20 = 1;
      iVar8 = 0;
      do {
        lVar6 = *in_RSI;
        lVar7 = in_RSI[4];
        uVar21 = 0;
        if ((long)(iVar13 + 2) < (long)uVar16) {
          uVar10 = (ulong)*(uint *)(lVar7 + (ulong)puVar5[iVar20] * 4);
          uVar14 = (ulong)*(uint *)(lVar7 + (ulong)puVar5[iVar13 + 2] * 4);
          lVar1 = lVar6 + uVar10;
          pbVar19 = (byte *)(lVar1 + 0x2e);
          uVar3 = *(ushort *)(lVar1 + 0x1c);
          uVar4 = *(ushort *)(lVar6 + 0x1c + uVar14);
          uVar21 = (uint)uVar4;
          if ((uint)uVar3 < (uint)uVar4) {
            uVar21 = (uint)uVar3;
          }
          pbVar23 = (byte *)(lVar6 + uVar10 + (ulong)uVar21 + 0x2e);
          if (uVar21 == 0) {
            bVar12 = 0;
            bVar22 = 0;
          }
          else {
            pbVar24 = (byte *)(uVar14 + lVar6 + 0x2e);
            do {
              bVar22 = *pbVar19;
              bVar12 = bVar22 + 0x20;
              if (0x19 < (byte)(bVar22 + 0xbf)) {
                bVar12 = bVar22;
              }
              bVar2 = *pbVar24;
              bVar22 = bVar2 + 0x20;
              if (0x19 < (byte)(bVar2 + 0xbf)) {
                bVar22 = bVar2;
              }
              if (bVar12 != bVar22) break;
              pbVar19 = pbVar19 + 1;
              pbVar24 = pbVar24 + 1;
              bVar22 = bVar12;
            } while (pbVar19 < pbVar23);
          }
          bVar11 = bVar12 < bVar22;
          if (pbVar19 == pbVar23) {
            bVar11 = uVar3 < uVar4;
          }
          uVar21 = (uint)bVar11;
        }
        iVar18 = uVar21 + iVar20;
        uVar10 = (ulong)*(uint *)(lVar7 + (ulong)uVar17 * 4);
        uVar14 = (ulong)*(uint *)(lVar7 + (ulong)puVar5[iVar18] * 4);
        lVar7 = lVar6 + uVar10;
        pbVar19 = (byte *)(lVar7 + 0x2e);
        uVar3 = *(ushort *)(lVar7 + 0x1c);
        uVar4 = *(ushort *)(lVar6 + 0x1c + uVar14);
        uVar21 = (uint)uVar4;
        if ((uint)uVar3 < (uint)uVar4) {
          uVar21 = (uint)uVar3;
        }
        pbVar23 = (byte *)((ulong)uVar21 + lVar6 + uVar10 + 0x2e);
        if (uVar21 == 0) {
          bVar22 = 0;
          bVar12 = 0;
        }
        else {
          pbVar24 = (byte *)(lVar6 + uVar14 + 0x2e);
          do {
            bVar12 = *pbVar19;
            bVar22 = bVar12 + 0x20;
            if (0x19 < (byte)(bVar12 + 0xbf)) {
              bVar22 = bVar12;
            }
            bVar2 = *pbVar24;
            bVar12 = bVar2 + 0x20;
            if (0x19 < (byte)(bVar2 + 0xbf)) {
              bVar12 = bVar2;
            }
            if (bVar22 != bVar12) break;
            pbVar19 = pbVar19 + 1;
            pbVar24 = pbVar24 + 1;
            bVar12 = bVar22;
          } while (pbVar19 < pbVar23);
        }
        bVar11 = bVar12 <= bVar22;
        if (pbVar19 == pbVar23) {
          bVar11 = uVar4 <= uVar3;
        }
        if (bVar11) break;
        puVar5[iVar8] = puVar5[iVar18];
        puVar5[iVar18] = uVar17;
        iVar13 = iVar18 * 2;
        iVar20 = iVar18 * 2 + 1;
        iVar8 = iVar18;
      } while ((long)iVar20 < (long)uVar16);
      bVar11 = 2 < uVar9;
      uVar9 = uVar16;
    } while (bVar11);
  }
  return;
}

Assistant:

static void
mz_zip_reader_sort_central_dir_offsets_by_filename(mz_zip_archive *pZip) {
  mz_zip_internal_state *pState = pZip->m_pState;
  const mz_zip_array *pCentral_dir_offsets = &pState->m_central_dir_offsets;
  const mz_zip_array *pCentral_dir = &pState->m_central_dir;
  mz_uint32 *pIndices = &MZ_ZIP_ARRAY_ELEMENT(
      &pState->m_sorted_central_dir_offsets, mz_uint32, 0);
  const int size = pZip->m_total_files;
  int start = (size - 2) >> 1, end;
  while (start >= 0) {
    int child, root = start;
    for (;;) {
      if ((child = (root << 1) + 1) >= size)
        break;
      child +=
          (((child + 1) < size) &&
           (mz_zip_reader_filename_less(pCentral_dir, pCentral_dir_offsets,
                                        pIndices[child], pIndices[child + 1])));
      if (!mz_zip_reader_filename_less(pCentral_dir, pCentral_dir_offsets,
                                       pIndices[root], pIndices[child]))
        break;
      MZ_SWAP_UINT32(pIndices[root], pIndices[child]);
      root = child;
    }
    start--;
  }

  end = size - 1;
  while (end > 0) {
    int child, root = 0;
    MZ_SWAP_UINT32(pIndices[end], pIndices[0]);
    for (;;) {
      if ((child = (root << 1) + 1) >= end)
        break;
      child +=
          (((child + 1) < end) &&
           mz_zip_reader_filename_less(pCentral_dir, pCentral_dir_offsets,
                                       pIndices[child], pIndices[child + 1]));
      if (!mz_zip_reader_filename_less(pCentral_dir, pCentral_dir_offsets,
                                       pIndices[root], pIndices[child]))
        break;
      MZ_SWAP_UINT32(pIndices[root], pIndices[child]);
      root = child;
    }
    end--;
  }
}